

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O2

bool cmFileAPI::ReadQuery
               (string *query,vector<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_> *objects
               )

{
  bool bVar1;
  long lVar2;
  unsigned_long uStack_80;
  value_type local_70;
  string verStr;
  string kindName;
  
  lVar2 = std::__cxx11::string::find((char)query,0x2d);
  if (lVar2 == -1) {
    return false;
  }
  std::__cxx11::string::substr((ulong)&kindName,(ulong)query);
  std::__cxx11::string::substr((ulong)&verStr,(ulong)query);
  bVar1 = std::operator==(&kindName,"codemodel");
  if (bVar1) {
    local_70.Kind = CodeModel;
    bVar1 = std::operator==(&verStr,"v2");
    if (bVar1) {
      local_70.Version = 2;
      std::vector<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>::push_back
                (objects,&local_70);
    }
    goto LAB_00204c37;
  }
  bVar1 = std::operator==(&kindName,"cache");
  if (bVar1) {
    local_70.Kind = Cache;
    bVar1 = std::operator==(&verStr,"v2");
    if (bVar1) {
      local_70.Version = 2;
      std::vector<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>::push_back
                (objects,&local_70);
    }
    goto LAB_00204c37;
  }
  bVar1 = std::operator==(&kindName,"cmakeFiles");
  if (bVar1) {
    local_70.Kind = CMakeFiles;
    bVar1 = std::operator==(&verStr,"v1");
    if (bVar1) {
      local_70.Version = 1;
      std::vector<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>::push_back
                (objects,&local_70);
    }
    goto LAB_00204c37;
  }
  bVar1 = std::operator==(&kindName,"__test");
  if (bVar1) {
    local_70.Kind = InternalTest;
    bVar1 = std::operator==(&verStr,"v1");
    if (bVar1) {
      uStack_80 = 1;
    }
    else {
      bVar1 = std::operator==(&verStr,"v2");
      if (!bVar1) goto LAB_00204c34;
      uStack_80 = 2;
    }
    local_70.Version = uStack_80;
    bVar1 = true;
    std::vector<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>::push_back(objects,&local_70)
    ;
  }
  else {
LAB_00204c34:
    bVar1 = false;
  }
LAB_00204c37:
  std::__cxx11::string::~string((string *)&verStr);
  std::__cxx11::string::~string((string *)&kindName);
  return bVar1;
}

Assistant:

bool cmFileAPI::ReadQuery(std::string const& query,
                          std::vector<Object>& objects)
{
  // Parse the "<kind>-" syntax.
  std::string::size_type sep_pos = query.find('-');
  if (sep_pos == std::string::npos) {
    return false;
  }
  std::string kindName = query.substr(0, sep_pos);
  std::string verStr = query.substr(sep_pos + 1);
  if (kindName == ObjectKindName(ObjectKind::CodeModel)) {
    Object o;
    o.Kind = ObjectKind::CodeModel;
    if (verStr == "v2") {
      o.Version = 2;
    } else {
      return false;
    }
    objects.push_back(o);
    return true;
  }
  if (kindName == ObjectKindName(ObjectKind::Cache)) {
    Object o;
    o.Kind = ObjectKind::Cache;
    if (verStr == "v2") {
      o.Version = 2;
    } else {
      return false;
    }
    objects.push_back(o);
    return true;
  }
  if (kindName == ObjectKindName(ObjectKind::CMakeFiles)) {
    Object o;
    o.Kind = ObjectKind::CMakeFiles;
    if (verStr == "v1") {
      o.Version = 1;
    } else {
      return false;
    }
    objects.push_back(o);
    return true;
  }
  if (kindName == ObjectKindName(ObjectKind::InternalTest)) {
    Object o;
    o.Kind = ObjectKind::InternalTest;
    if (verStr == "v1") {
      o.Version = 1;
    } else if (verStr == "v2") {
      o.Version = 2;
    } else {
      return false;
    }
    objects.push_back(o);
    return true;
  }
  return false;
}